

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O1

ostream * operator<<(ostream *output,sax_event_t *event)

{
  ostream *poVar1;
  ostream *poVar2;
  long lVar3;
  bool bVar4;
  char *pcVar5;
  pointer pbVar6;
  string local_50;
  
  poVar1 = output;
  switch(event->type) {
  case invalid_type:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "invalid";
    lVar3 = 7;
    break;
  case start_document:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "start_document";
    lVar3 = 0xe;
    break;
  case finish_document:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "finish_document";
    lVar3 = 0xf;
    break;
  case comment:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"comment",7);
    std::__ostream_insert<char,std::char_traits<char>>(output,", \'",3);
    escape_string(&local_50,&event->string_data);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'}",2);
    goto LAB_001535ea;
  case table:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"table",5);
    std::__ostream_insert<char,std::char_traits<char>>(output,", {",3);
    pbVar6 = (event->keys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar6 != (event->keys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      bVar4 = true;
      do {
        if (bVar4) {
          bVar4 = false;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(output,", ",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>(output,"\'",1);
        escape_string(&local_50,pbVar6);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (output,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != (event->keys).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    goto LAB_001534ee;
  case table_array_item:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"table_array_item",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(output,", {",3);
    pbVar6 = (event->keys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar6 != (event->keys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      bVar4 = true;
      do {
        if (bVar4) {
          bVar4 = false;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(output,", ",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>(output,"\'",1);
        escape_string(&local_50,pbVar6);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (output,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != (event->keys).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
LAB_001534ee:
    pcVar5 = "}}";
    lVar3 = 2;
    goto LAB_0015367c;
  case key:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"key",3);
    std::__ostream_insert<char,std::char_traits<char>>(output,", \'",3);
    escape_string(&local_50,&event->string_data);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'}",2);
    goto LAB_001535ea;
  case start_array:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "start_array";
    lVar3 = 0xb;
    break;
  case finish_array:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "finish_array";
    lVar3 = 0xc;
    goto LAB_00153645;
  case start_inline_table:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "start_inline_table";
    lVar3 = 0x12;
    break;
  case finish_inline_table:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "finish_inline_table";
    lVar3 = 0x13;
    goto LAB_00153645;
  case boolean:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"boolean",7);
    std::__ostream_insert<char,std::char_traits<char>>(output,", ",2);
    poVar1 = std::ostream::_M_insert<bool>(SUB81(output,0));
    goto LAB_0015366d;
  case string:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"string",6);
    std::__ostream_insert<char,std::char_traits<char>>(output,", \'",3);
    escape_string(&local_50,&event->string_data);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'}",2);
    goto LAB_001535ea;
  case datetime:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"datetime",8);
    std::__ostream_insert<char,std::char_traits<char>>(output,", \'",3);
    escape_string(&local_50,&event->string_data);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'}",2);
LAB_001535ea:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return output;
    }
    operator_delete(local_50._M_dataplus._M_p);
    return output;
  case integer:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    pcVar5 = "integer";
    lVar3 = 7;
LAB_00153645:
    std::__ostream_insert<char,std::char_traits<char>>(output,pcVar5,lVar3);
    std::__ostream_insert<char,std::char_traits<char>>(output,", ",2);
    poVar1 = std::ostream::_M_insert<long>((long)output);
LAB_0015366d:
    pcVar5 = "}";
    lVar3 = 1;
    goto LAB_0015367c;
  case floating_point:
    std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>(output,"floating_point",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(output,", ",2);
    poVar1 = std::ostream::_M_insert<double>(event->float_data);
    goto LAB_0015366d;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/common.hpp"
                  ,0xdd,"std::ostream &operator<<(std::ostream &, const sax_event_t &)");
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,pcVar5,lVar3);
  pcVar5 = "}";
  lVar3 = 1;
LAB_0015367c:
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar5,lVar3);
  return output;
}

Assistant:

inline std::ostream &operator<<(std::ostream &output, const sax_event_t &event) {
    switch(event.type) {
    case sax_event_t::invalid_type: {
        output << "{" << "invalid" << "}";
    } break;
    case sax_event_t::start_document: {
        output << "{" << "start_document" << "}";
    } break;
    case sax_event_t::finish_document: {
        output << "{" << "finish_document" << "}";
    } break;
    case sax_event_t::comment: {
        output << "{" << "comment" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::table: {
        output << "{" << "table" << ", {";

        bool first = true;
        for (auto it = event.keys.begin(); it != event.keys.end(); ++it) {
            if (!first) {
                output << ", ";
            } else {
                first = false;
            }

            output << "'" << escape_string(*it) << "'";
        }

        output << "}}";
    } break;
    case sax_event_t::table_array_item: {
        output << "{" << "table_array_item" << ", {";

        bool first = true;
        for (auto it = event.keys.begin(); it != event.keys.end(); ++it) {
            if (!first) {
                output << ", ";
            } else {
                first = false;
            }

            output << "'" << escape_string(*it) << "'";
        }

        output << "}}";
    } break;
    case sax_event_t::key: {
        output << "{" << "key" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::start_array: {
        output << "{" << "start_array" << "}";
    } break;
    case sax_event_t::finish_array: {
        output << "{" << "finish_array" << ", " << event.int_data << "}";
    } break;
    case sax_event_t::start_inline_table: {
        output << "{" << "start_inline_table" << "}";
    } break;
    case sax_event_t::finish_inline_table: {
        output << "{" << "finish_inline_table" << ", " << event.int_data << "}";
    } break;
    case sax_event_t::boolean: {
        output << "{" << "boolean" << ", " << event.bool_data << "}";
    } break;
    case sax_event_t::string: {
        output << "{" << "string" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::datetime: {
        output << "{" << "datetime" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::integer: {
        output << "{" << "integer" << ", " << event.int_data << "}";
    } break;
    case sax_event_t::floating_point: {
        output << "{" << "floating_point" << ", " << event.float_data << "}";
    } break;
    default: assert(false);
    }

    return output;
}